

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_SHORT_BEAM(effect_handler_context_t *context)

{
  wchar_t typ;
  anon_enum_32 aVar1;
  _Bool _Var2;
  wchar_t dam;
  wchar_t wVar3;
  wchar_t wVar4;
  uint8_t diameter_of_source;
  int iVar5;
  wchar_t wVar6;
  source origin;
  loc target;
  
  iVar5 = 0;
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  typ = context->subtype;
  if ((context->origin).what == SRC_PLAYER) {
    wVar6 = context->radius;
    if (L'\0' < context->other) {
      wVar3 = eff_level(player);
      iVar5 = wVar3 / context->other;
    }
  }
  else {
    wVar6 = context->radius;
  }
  wVar6 = wVar6 + iVar5;
  target = (loc)loc(-1,-1);
  aVar1 = (context->origin).what;
  wVar3 = L'Ѱ';
  if (aVar1 == SRC_PLAYER) {
    wVar4 = context->dir;
    if (wVar4 == L'\x05') {
      _Var2 = target_okay();
      if (_Var2) {
        target_get((loc_conflict *)&target);
        goto LAB_00138422;
      }
      wVar4 = context->dir;
    }
    target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[wVar4]);
  }
  else if (aVar1 == SRC_MONSTER) {
    target.x = (player->grid).x;
    target.y = (player->grid).y;
    wVar3 = L'౰';
  }
LAB_00138422:
  diameter_of_source = '\x19';
  if (wVar6 < L'\x19') {
    diameter_of_source = (uint8_t)wVar6;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var2 = project(origin,wVar6,target,dam,typ,wVar3,L'\0',diameter_of_source,context->obj);
  if (_Var2) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_SHORT_BEAM(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int type = context->subtype;
	bool add = (context->origin.what == SRC_PLAYER) && (context->other > 0);
	int rad = context->radius + (add ? eff_level(player) / context->other : 0);

	struct loc target = loc(-1, -1);

	/* Diameter of source is the same as the radius, so the effect is
	 * essentially full strength for its entire length. */
	int diameter_of_source = rad;

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		flg |= PROJECT_PLAY;
		target = player->grid;
	} else if (context->origin.what == SRC_PLAYER) {
		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Check bounds */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Aim at the target */
	if (project(context->origin, rad, target, dam, type, flg, 0,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}